

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O3

Handle remote::OpenProcess(string *name)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  char *__s;
  bool bVar8;
  pid_t pid;
  Handle hProcess;
  string path;
  stringstream ss;
  char maps [4096];
  int local_1210;
  Handle local_120c;
  string *local_1208;
  string local_1200;
  undefined1 *local_11e0 [2];
  undefined1 local_11d0 [16];
  stringstream local_11c0 [16];
  long local_11b0 [3];
  uint auStack_1198 [22];
  ios_base local_1140 [264];
  char local_1038 [4];
  undefined2 auStack_1034 [2050];
  
  local_1208 = name;
  __dirp = opendir("/proc/");
  if ((__dirp != (DIR *)0x0) && (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0)) {
    do {
      if (pdVar4->d_type == '\x04') {
        __s = pdVar4->d_name;
        sVar5 = strspn(__s,"0123456789");
        sVar6 = strlen(__s);
        if (sVar5 == sVar6) {
          strncpy(local_1038,"/proc/",0x1000);
          strncat(local_1038,__s,0x1000);
          sVar5 = strlen(local_1038);
          builtin_strncpy(local_1038 + sVar5,"/map",4);
          *(undefined2 *)((long)auStack_1034 + sVar5) = 0x73;
          iVar2 = access(local_1038,0);
          if (iVar2 != -1) {
            std::__cxx11::stringstream::stringstream(local_11c0);
            *(uint *)((long)auStack_1198 + *(long *)(local_11b0[0] + -0x18)) =
                 *(uint *)((long)auStack_1198 + *(long *)(local_11b0[0] + -0x18)) & 0xffffffb5 | 2;
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_11b0,__s,sVar5);
            std::istream::operator>>((istream *)local_11c0,&local_1210);
            iVar2 = local_1210;
            local_1200._M_dataplus._M_p._0_4_ = local_1210;
            bVar1 = Handle::IsRunning((Handle *)&local_1200);
            local_120c.pid = -1;
            if (bVar1) {
              local_120c.pid = iVar2;
            }
            if (local_120c.pid != -1) {
              Handle::GetPath_abi_cxx11_(&local_1200,&local_120c);
              lVar7 = std::__cxx11::string::rfind('\0',0x2f);
              if (lVar7 == -1) {
                bVar8 = false;
                bVar1 = false;
              }
              else {
                std::__cxx11::string::substr((ulong)local_11e0,(ulong)&local_1200);
                iVar3 = std::__cxx11::string::compare((string *)local_11e0);
                bVar1 = iVar3 != 0;
                if (local_11e0[0] != local_11d0) {
                  operator_delete(local_11e0[0]);
                }
                bVar8 = iVar3 == 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_1200._M_dataplus._M_p._4_4_,(int)local_1200._M_dataplus._M_p) !=
                  &local_1200.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_1200._M_dataplus._M_p._4_4_,
                                         (int)local_1200._M_dataplus._M_p));
              }
              if (!bVar1) {
                std::__cxx11::stringstream::~stringstream(local_11c0);
                std::ios_base::~ios_base(local_1140);
                if (bVar8) {
                  return (Handle)iVar2;
                }
                goto LAB_001059d2;
              }
            }
            std::__cxx11::stringstream::~stringstream(local_11c0);
            std::ios_base::~ios_base(local_1140);
          }
        }
      }
LAB_001059d2:
      pdVar4 = readdir(__dirp);
    } while (pdVar4 != (dirent *)0x0);
  }
  return (Handle)-1;
}

Assistant:

Handle remote::OpenProcess(string name) {
    DIR* dir = opendir("/proc/");

    if(dir) {
        dirent* dire = NULL;

        while((dire = readdir(dir)) != NULL) {
            if(dire->d_type != DT_DIR)
                continue;

            // Check numeric
            if(strspn(dire->d_name, "0123456789") != strlen(dire->d_name))
                continue;

            char maps[PATH_MAX];
            strncpy(maps, "/proc/", PATH_MAX);
            strncat(maps, dire->d_name, PATH_MAX);
            strncat(maps, "/maps", PATH_MAX);

            if (access(maps, F_OK) == -1)
                continue;

            pid_t pid;

            stringstream ss;
            ss << dec << dire->d_name;
            ss >> pid;

            Handle hProcess = OpenProcess(pid);

            if(hProcess != INVALID_HANDLE_VALUE) {
                string path = hProcess.GetPath();

                size_t lastSlash = path.find_last_of('/');

                if(lastSlash == -1)
                    continue;

                if(path.substr(lastSlash, path.size()).compare(name) == 0)
                    return hProcess;
            }
        }
    }

    return INVALID_HANDLE_VALUE;
}